

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_GlassBreak(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FState *pFVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AActor *this;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int local_bc;
  undefined1 local_b8 [4];
  int i_1;
  FName local_a0;
  int local_9c;
  undefined1 local_98 [4];
  int i;
  TVector2<double> local_88;
  undefined1 local_78 [24];
  double local_60;
  undefined1 local_58 [8];
  DVector2 normal;
  DVector2 linemid;
  AActor *glass;
  int local_28;
  bool quest2;
  bool quest1;
  int iStack_24;
  bool switched;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  ln->flags = ln->flags & 0xffff7ffe;
  local_28 = arg2;
  iStack_24 = arg1;
  arg2_local = arg0;
  arg1_local._3_1_ = backSide;
  _arg0_local = it;
  it_local = (AActor *)ln;
  glass._7_1_ = P_ChangeSwitchTexture(ln->sidedef[0],0,'\0',(bool *)((long)&glass + 6));
  *(undefined4 *)&(it_local->super_DThinker).NextThinker = 0;
  if ((it_local->__Pos).Y == 0.0) {
    glass._5_1_ = glass._6_1_ & 1;
  }
  else {
    bVar2 = P_ChangeSwitchTexture((side_t *)(it_local->__Pos).Y,0,'\0',(bool *)((long)&glass + 5));
    glass._7_1_ = (glass._7_1_ & 1) != 0 || bVar2;
  }
  if ((bool)glass._7_1_ != false) {
    if (arg2_local == 0) {
      dVar5 = vertex_t::fX((vertex_t *)(it_local->super_DThinker).super_DObject._vptr_DObject);
      dVar6 = vertex_t::fX((vertex_t *)(it_local->super_DThinker).super_DObject.Class);
      dVar7 = vertex_t::fY((vertex_t *)(it_local->super_DThinker).super_DObject._vptr_DObject);
      dVar8 = vertex_t::fY((vertex_t *)(it_local->super_DThinker).super_DObject.Class);
      TVector2<double>::TVector2
                ((TVector2<double> *)&normal.Y,(dVar5 + dVar6) / 2.0,(dVar7 + dVar8) / 2.0);
      line_t::Delta((line_t *)(local_78 + 0x10));
      line_t::Delta((line_t *)local_78);
      TVector2<double>::TVector2((TVector2<double> *)local_58,local_60,-(double)local_78._0_8_);
      TVector2<double>::Unit((TVector2<double> *)local_98);
      operator*(&local_88,2.0);
      TVector2<double>::operator+=((TVector2<double> *)&normal.Y,&local_88);
      for (local_9c = 0; local_9c < 7; local_9c = local_9c + 1) {
        FName::FName(&local_a0,"GlassJunk");
        TVector3<double>::TVector3((TVector3<double> *)local_b8,(Vector2 *)&normal.Y,-2147483648.0);
        this = Spawn(&local_a0,(DVector3 *)local_b8,ALLOW_REPLACE);
        AActor::AddZ(this,24.0,true);
        pFVar1 = this->SpawnState;
        iVar3 = FRandom::operator()(&pr_glass);
        AActor::SetState(this,pFVar1 + iVar3 % this->health,false);
        iVar3 = FRandom::operator()(&pr_glass);
        TAngle<double>::operator=(&(this->Angles).Yaw,(double)iVar3 * 1.40625);
        uVar4 = FRandom::operator()(&pr_glass);
        AActor::VelFromAngle(this,(double)(uVar4 & 3));
        uVar4 = FRandom::operator()(&pr_glass);
        (this->Vel).Z = (double)(uVar4 & 7);
        iVar3 = FRandom::operator()(&pr_glass);
        this->tics = iVar3 + this->tics;
      }
    }
    if (((glass._6_1_ & 1) != 0) || ((glass._5_1_ & 1) != 0)) {
      if (_arg0_local == (AActor *)0x0) {
        for (local_bc = 0; local_bc < 8; local_bc = local_bc + 1) {
          if ((playeringame[local_bc] & 1U) != 0) {
            _arg0_local = (AActor *)(&players)[(long)local_bc * 0x54];
            break;
          }
        }
      }
      if (_arg0_local != (AActor *)0x0) {
        AActor::GiveInventoryType(_arg0_local,QuestItemClasses[0x1c]);
        AActor::GiveInventoryType
                  (_arg0_local,(PClassActor *)AUpgradeAccuracy::RegistrationInfo.MyClass);
        AActor::GiveInventoryType
                  (_arg0_local,(PClassActor *)AUpgradeStamina::RegistrationInfo.MyClass);
      }
    }
  }
  return 0;
}

Assistant:

FUNC(LS_GlassBreak)
// GlassBreak (bNoJunk)
{
	bool switched;
	bool quest1, quest2;

	ln->flags &= ~(ML_BLOCKING|ML_BLOCKEVERYTHING);
	switched = P_ChangeSwitchTexture (ln->sidedef[0], false, 0, &quest1);
	ln->special = 0;
	if (ln->sidedef[1] != NULL)
	{
		switched |= P_ChangeSwitchTexture (ln->sidedef[1], false, 0, &quest2);
	}
	else
	{
		quest2 = quest1;
	}
	if (switched)
	{
		if (!arg0)
		{ // Break some glass
			AActor *glass;

			DVector2 linemid((ln->v1->fX() + ln->v2->fX()) / 2, (ln->v1->fY() + ln->v2->fY()) / 2);

			// remove dependence on sector size and always spawn 2 map units in front of the line.
			DVector2 normal(ln->Delta().Y, -ln->Delta().X);
			linemid += normal.Unit() * 2;
			/* old code:
			x += (ln->frontsector->centerspot.x - x) / 5;
			y += (ln->frontsector->centerspot.y - y) / 5;
			*/

			for (int i = 0; i < 7; ++i)
			{
				glass = Spawn("GlassJunk", DVector3(linemid, ONFLOORZ), ALLOW_REPLACE);

				glass->AddZ(24.);
				glass->SetState (glass->SpawnState + (pr_glass() % glass->health));

				glass->Angles.Yaw = pr_glass() * (360 / 256.);
				glass->VelFromAngle(pr_glass() & 3);
				glass->Vel.Z = (pr_glass() & 7);
				// [RH] Let the shards stick around longer than they did in Strife.
				glass->tics += pr_glass();
			}
		}
		if (quest1 || quest2)
		{ // Up stats and signal this mission is complete
			if (it == NULL)
			{
				for (int i = 0; i < MAXPLAYERS; ++i)
				{
					if (playeringame[i])
					{
						it = players[i].mo;
						break;
					}
				}
			}
			if (it != NULL)
			{
				it->GiveInventoryType (QuestItemClasses[28]);
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeAccuracy));
				it->GiveInventoryType (RUNTIME_CLASS(AUpgradeStamina));
			}
		}
	}
	// We already changed the switch texture, so don't make the main code switch it back.
	return false;
}